

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,std::shared_ptr<Person>&>
          (pybind11 *this,shared_ptr<Person> *args_)

{
  element_type *_src;
  array<pybind11::object,_1UL> aVar1;
  runtime_error *this_00;
  long *plVar2;
  pointer_____offset_0x10___ *type_info;
  long *plVar3;
  array<pybind11::object,_1UL> args;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  _src = (args_->super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  type_info = &Person::typeinfo;
  if (_src == (element_type *)0x0) {
    type_info = (pointer_____offset_0x10___ *)0x0;
  }
  args._M_elems[0].super_handle.m_ptr =
       (_Type)detail::type_caster_generic::cast
                        (_src,take_ownership,(handle)0x0,(type_info *)type_info,
                         (type_info *)&Person::typeinfo,(_func_void_ptr_void_ptr *)0x0,
                         (_func_void_ptr_void_ptr *)0x0,args_);
  if (args._M_elems[0].super_handle.m_ptr != (object)0x0) {
    tuple::tuple((tuple *)this,1);
    aVar1._M_elems[0].super_handle.m_ptr = args._M_elems[0].super_handle.m_ptr;
    args._M_elems[0].super_handle.m_ptr = (_Type)(object)0x0;
    if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) != 0) {
      (*(_Type *)(*(long *)this + 0x18))[0] = (object)aVar1._M_elems[0].super_handle.m_ptr;
      object::~object(args._M_elems);
      return (object)(object)this;
    }
    __assert_fail("PyTuple_Check(result.ptr())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/cast.h"
                  ,0x496,
                  "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <std::shared_ptr<Person> &>]"
                 );
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  type_id<std::tuple<std::shared_ptr<Person>&>>();
  std::operator+(&local_40,"make_tuple(): unable to convert arguments of types \'",&local_60);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_80 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_80 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_80);
  *(undefined ***)this_00 = &PTR__runtime_error_001189b8;
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    const size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (auto &arg_value : args) {
        if (!arg_value) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            throw cast_error("make_tuple(): unable to convert arguments of types '" +
                (std::string) type_id<std::tuple<Args...>>() + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}